

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionBGCGWrapper.h
# Opt level: O1

void __thiscall LocalBGValueFunctionBGCGWrapper::Print(LocalBGValueFunctionBGCGWrapper *this)

{
  ostream *poVar1;
  long *local_28;
  long local_20;
  long local_18 [2];
  
  (*(this->super_LocalBGValueFunctionInterface)._vptr_LocalBGValueFunctionInterface[7])
            (&local_28,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_28,local_20);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  return;
}

Assistant:

void Print() const { std::cout << SoftPrint() << std::endl; }